

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

float If_CutEdgeFlow(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  If_Cut_t *pIVar2;
  bool bVar3;
  int local_2c;
  float local_28;
  int i;
  float AddOn;
  float Flow;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  i = (int)(float)(byte)pCut->field_0x1f;
  local_2c = 0;
  while( true ) {
    bVar3 = false;
    if (local_2c < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      _AddOn = If_ManObj(p,(int)(&pCut[1].Area)[local_2c]);
      bVar3 = _AddOn != (If_Obj_t *)0x0;
    }
    if (!bVar3) break;
    if ((_AddOn->nRefs == 0) || (iVar1 = If_ObjIsConst1(_AddOn), iVar1 != 0)) {
      pIVar2 = If_ObjCutBest(_AddOn);
      local_28 = pIVar2->Edge;
    }
    else {
      if (_AddOn->EstRefs < p->fEpsilon || _AddOn->EstRefs == p->fEpsilon) {
        __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                      ,0x3c9,"float If_CutEdgeFlow(If_Man_t *, If_Cut_t *)");
      }
      pIVar2 = If_ObjCutBest(_AddOn);
      local_28 = pIVar2->Edge / _AddOn->EstRefs;
    }
    if ((1e+32 <= (float)i) || (1e+32 <= local_28)) {
      i = 0x749dc5ae;
    }
    else {
      i = (int)(local_28 + (float)i);
      if (1e+32 < (float)i) {
        i = 0x749dc5ae;
      }
    }
    local_2c = local_2c + 1;
  }
  return (float)i;
}

Assistant:

float If_CutEdgeFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow, AddOn;
    int i;
    Flow = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            AddOn = If_ObjCutBest(pLeaf)->Edge;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            AddOn = If_ObjCutBest(pLeaf)->Edge / pLeaf->EstRefs;
        }
        if ( Flow >= (float)1e32 || AddOn >= (float)1e32 )
            Flow = (float)1e32;
        else 
        {
            Flow += AddOn;
            if ( Flow > (float)1e32 )
                 Flow = (float)1e32;
        }
    }
    return Flow;
}